

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::RunContext::invokeActiveTestCase(RunContext *this)

{
  FatalConditionHandler::FatalConditionHandler((FatalConditionHandler *)this);
  (**((this->m_activeTestCase->test).
      super___shared_ptr<Catch::ITestInvoker,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     _vptr_ITestInvoker)();
  FatalConditionHandler::reset();
  FatalConditionHandler::reset();
  return;
}

Assistant:

void RunContext::invokeActiveTestCase() {
        FatalConditionHandler fatalConditionHandler; // Handle signals
        m_activeTestCase->invoke();
        fatalConditionHandler.reset();
    }